

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

DisasJumpType op_bcth(DisasContext_conflict13 *s,DisasOps *o)

{
  TCGContext_conflict12 *tcg_ctx_00;
  DisasJumpType DVar1;
  TCGv_i64 ret;
  TCGv_i64 t;
  DisasCompare_conflict2 c;
  int imm;
  int r1;
  TCGContext_conflict12 *tcg_ctx;
  DisasOps *o_local;
  DisasContext_conflict13 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  c.u._12_4_ = get_field1(s,FLD_O_r1,FLD_C_b1);
  c.u._8_4_ = get_field1(s,FLD_O_i2,FLD_C_b2);
  t._0_1_ = 9;
  t._1_1_ = 0;
  t._2_1_ = 0;
  t._3_1_ = 0;
  ret = tcg_temp_new_i64(tcg_ctx_00);
  tcg_gen_shri_i64_s390x(tcg_ctx_00,ret,tcg_ctx_00->regs[(int)c.u._12_4_],0x20);
  tcg_gen_subi_i64_s390x(tcg_ctx_00,ret,ret,1);
  store_reg32h_i64(tcg_ctx_00,c.u._12_4_,ret);
  c._0_8_ = tcg_temp_new_i32(tcg_ctx_00);
  c.u.s32.a = tcg_const_i32_s390x(tcg_ctx_00,0);
  tcg_gen_extrl_i64_i32_s390x(tcg_ctx_00,(TCGv_i32)c._0_8_,ret);
  tcg_temp_free_i64(tcg_ctx_00,ret);
  DVar1 = help_branch(s,(DisasCompare_conflict2 *)&t,true,c.u._8_4_,o->in2);
  return DVar1;
}

Assistant:

static DisasJumpType op_bcth(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int r1 = get_field(s, r1);
    int imm = get_field(s, i2);
    DisasCompare c;
    TCGv_i64 t;

    c.cond = TCG_COND_NE;
    c.is_64 = false;
    c.g1 = false;
    c.g2 = false;

    t = tcg_temp_new_i64(tcg_ctx);
    tcg_gen_shri_i64(tcg_ctx, t, tcg_ctx->regs[r1], 32);
    tcg_gen_subi_i64(tcg_ctx, t, t, 1);
    store_reg32h_i64(tcg_ctx, r1, t);
    c.u.s32.a = tcg_temp_new_i32(tcg_ctx);
    c.u.s32.b = tcg_const_i32(tcg_ctx, 0);
    tcg_gen_extrl_i64_i32(tcg_ctx, c.u.s32.a, t);
    tcg_temp_free_i64(tcg_ctx, t);

    return help_branch(s, &c, 1, imm, o->in2);
}